

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segdmp.c
# Opt level: O2

int segdmp_add_feat(uint32 id,vector_t **feat,uint32 n_seg_frame)

{
  seg_t **ppsVar1;
  uint32 uVar2;
  seg_t *psVar3;
  ulong uVar4;
  
  if (alloc_frm_buf < frame_sz * n_seg_frame + nxt_frm_buf) {
    dump_frm_buf();
  }
  psVar3 = (seg_t *)__ckd_calloc__(1,0x10,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
                                   ,0x2a1);
  psVar3->len = n_seg_frame;
  uVar2 = nxt_frm_buf;
  uVar4 = (ulong)nxt_frm_buf;
  psVar3->idx = nxt_frm_buf;
  ppsVar1 = t_seg;
  if (t_seg[id] != (seg_t *)0x0) {
    t_seg[id]->next = psVar3;
  }
  ppsVar1[id] = psVar3;
  if (h_seg[id] == (seg_t *)0x0) {
    h_seg[id] = psVar3;
  }
  memcpy(frm_buf + uVar4,**feat,(ulong)(frame_sz * n_seg_frame));
  nxt_frm_buf = n_seg_frame * frame_sz + uVar2;
  return 0;
}

Assistant:

int
segdmp_add_feat(uint32 id,
		vector_t **feat,
		uint32 n_seg_frame)
{
    seg_t *s;

    if (n_seg_frame*frame_sz + nxt_frm_buf > alloc_frm_buf) {
	dump_frm_buf();
    }

    s = ckd_calloc(1, sizeof(seg_t));

    s->len = n_seg_frame;
    s->idx = nxt_frm_buf;

    if (t_seg[id]) {
	t_seg[id]->next = s;
    }

    t_seg[id] = s;

    if (h_seg[id] == NULL) {
	h_seg[id] = t_seg[id];
    }

    memcpy(&frm_buf[nxt_frm_buf],
	   (const void *)&feat[0][0][0],
	   n_seg_frame * frame_sz);
    
    nxt_frm_buf += n_seg_frame * frame_sz;
    
    return S3_SUCCESS;
}